

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

int Sbd_ManWindow(Sbd_Man_t *p,int Pivot)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  word *pwVar8;
  word *pwVar9;
  abctime aVar10;
  word *pwVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  
  aVar5 = Abc_Clock();
  p->Pivot = Pivot;
  pVVar6 = Vec_WecEntry(p->vTfos,Pivot);
  p->vTfo = pVVar6;
  p->vWinObjs->nSize = 0;
  Vec_IntWriteEntry(p->vObj2Var,0,0);
  Vec_IntPush(p->vWinObjs,0);
  Gia_ManIncrementTravId(p->pGia);
  Gia_ObjSetTravIdCurrentId(p->pGia,0);
  Sbd_ManWindowSim_rec(p,Pivot);
  iVar14 = p->pPars->nWinSizeMax;
  if ((iVar14 == 0) || (p->vWinObjs->nSize <= iVar14)) {
    Sbd_ManUpdateOrder(p,Pivot);
    iVar14 = p->vDivVars->nSize;
    if (iVar14 != p->vDivValues->nSize) {
      __assert_fail("Vec_IntSize(p->vDivVars) == Vec_IntSize(p->vDivValues)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x1d1,"int Sbd_ManWindow(Sbd_Man_t *, int)");
    }
    if (p->vWinObjs->nSize <= iVar14) {
      __assert_fail("Vec_IntSize(p->vDivVars) < Vec_IntSize(p->vWinObjs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x1d2,"int Sbd_ManWindow(Sbd_Man_t *, int)");
    }
    pGVar7 = Gia_ManObj(p->pGia,Pivot);
    pGVar7->field_0x3 = pGVar7->field_0x3 | 0x40;
    pwVar8 = Sbd_ObjSim1(p,Pivot);
    pwVar9 = Sbd_ObjSim0(p,Pivot);
    Abc_TtCopy(pwVar8,pwVar9,p->pPars->nWords,1);
    p->vRoots->nSize = 0;
    for (iVar14 = 0; iVar14 < p->vTfo->nSize; iVar14 = iVar14 + 1) {
      iVar3 = Vec_IntEntry(p->vTfo,iVar14);
      pGVar2 = p->pGia;
      iVar4 = Abc_Lit2Var(iVar3);
      pGVar7 = Gia_ManObj(pGVar2,iVar4);
      pGVar7->field_0x3 = pGVar7->field_0x3 | 0x40;
      iVar4 = Abc_LitIsCompl(iVar3);
      if (iVar4 != 0) {
        iVar4 = Abc_Lit2Var(iVar3);
        Sbd_ManWindowSim_rec(p,iVar4);
        pVVar6 = p->vRoots;
        iVar3 = Abc_Lit2Var(iVar3);
        Vec_IntPush(pVVar6,iVar3);
      }
    }
    pGVar7 = Gia_ManObj(p->pGia,Pivot);
    pGVar7->field_0x3 = pGVar7->field_0x3 & 0xbf;
    iVar14 = 0;
    while( true ) {
      iVar3 = p->vTfo->nSize;
      if (iVar3 <= iVar14) break;
      iVar3 = Vec_IntEntry(p->vTfo,iVar14);
      pGVar2 = p->pGia;
      iVar4 = Abc_Lit2Var(iVar3);
      pGVar7 = Gia_ManObj(pGVar2,iVar4);
      pGVar7->field_0x3 = pGVar7->field_0x3 & 0xbf;
      pVVar6 = p->vObj2Var;
      iVar4 = Abc_Lit2Var(iVar3);
      Vec_IntWriteEntry(pVVar6,iVar4,p->vWinObjs->nSize);
      pVVar6 = p->vWinObjs;
      iVar3 = Abc_Lit2Var(iVar3);
      Vec_IntPush(pVVar6,iVar3);
      iVar14 = iVar14 + 1;
    }
    iVar14 = p->pPars->nWinSizeMax;
    if ((iVar14 == 0) || (p->vWinObjs->nSize <= iVar14)) {
      pwVar8 = Sbd_ObjSim2(p,Pivot);
      uVar1 = p->pPars->nWords;
      if (iVar3 == 0) {
        uVar12 = 0;
        uVar13 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar13 = uVar12;
        }
        for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
          pwVar8[uVar12] = 0xffffffffffffffff;
        }
      }
      else {
        Abc_TtClear(pwVar8,uVar1);
      }
      for (iVar14 = 0; iVar14 < p->vTfo->nSize; iVar14 = iVar14 + 1) {
        iVar3 = Vec_IntEntry(p->vTfo,iVar14);
        iVar4 = Abc_LitIsCompl(iVar3);
        if (iVar4 != 0) {
          pwVar8 = Sbd_ObjSim2(p,Pivot);
          iVar4 = Abc_Lit2Var(iVar3);
          pwVar9 = Sbd_ObjSim0(p,iVar4);
          iVar3 = Abc_Lit2Var(iVar3);
          pwVar11 = Sbd_ObjSim1(p,iVar3);
          uVar1 = p->pPars->nWords;
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          for (uVar13 = 0; uVar1 != uVar13; uVar13 = uVar13 + 1) {
            pwVar8[uVar13] = pwVar8[uVar13] | pwVar11[uVar13] ^ pwVar9[uVar13];
          }
        }
      }
      aVar10 = Abc_Clock();
      p->timeWin = p->timeWin + (aVar10 - aVar5);
      Sbd_ManPropagateControl(p,Pivot);
      if (p->vDivValues->nSize < 0x41) {
        return 1;
      }
      __assert_fail("Vec_IntSize(p->vDivValues) <= 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x1f8,"int Sbd_ManWindow(Sbd_Man_t *, int)");
    }
  }
  aVar10 = Abc_Clock();
  p->timeWin = p->timeWin + (aVar10 - aVar5);
  return 0;
}

Assistant:

int Sbd_ManWindow( Sbd_Man_t * p, int Pivot )
{
    abctime clk = Abc_Clock();
    int i, Node;
    // assign pivot and TFO (assume siminfo is assigned at the PIs)
    p->Pivot = Pivot;
    p->vTfo = Vec_WecEntry( p->vTfos, Pivot );
    // add constant node
    Vec_IntClear( p->vWinObjs );
    Vec_IntWriteEntry( p->vObj2Var, 0, Vec_IntSize(p->vWinObjs) );
    Vec_IntPush( p->vWinObjs, 0 );
    // simulate TFI cone
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrentId(p->pGia, 0);
    Sbd_ManWindowSim_rec( p, Pivot );
    if ( p->pPars->nWinSizeMax && Vec_IntSize(p->vWinObjs) > p->pPars->nWinSizeMax )
    {
        p->timeWin += Abc_Clock() - clk;
        return 0;
    }
    Sbd_ManUpdateOrder( p, Pivot );
    assert( Vec_IntSize(p->vDivVars) == Vec_IntSize(p->vDivValues) );
    assert( Vec_IntSize(p->vDivVars) < Vec_IntSize(p->vWinObjs) );
    // simulate node
    Gia_ManObj(p->pGia, Pivot)->fMark0 = 1;
    Abc_TtCopy( Sbd_ObjSim1(p, Pivot), Sbd_ObjSim0(p, Pivot), p->pPars->nWords, 1 );
    // mark TFO and simulate extended TFI without adding TFO nodes
    Vec_IntClear( p->vRoots );
    Vec_IntForEachEntry( p->vTfo, Node, i )
    {
        Gia_ManObj(p->pGia, Abc_Lit2Var(Node))->fMark0 = 1;
        if ( !Abc_LitIsCompl(Node) ) 
            continue;
        Sbd_ManWindowSim_rec( p, Abc_Lit2Var(Node) );
        Vec_IntPush( p->vRoots, Abc_Lit2Var(Node) );
    }
    // add TFO nodes and remove marks
    Gia_ManObj(p->pGia, Pivot)->fMark0 = 0;
    Vec_IntForEachEntry( p->vTfo, Node, i )
    {
        Gia_ManObj(p->pGia, Abc_Lit2Var(Node))->fMark0 = 0;
        Vec_IntWriteEntry( p->vObj2Var, Abc_Lit2Var(Node), Vec_IntSize(p->vWinObjs) );
        Vec_IntPush( p->vWinObjs, Abc_Lit2Var(Node) );
    }
    if ( p->pPars->nWinSizeMax && Vec_IntSize(p->vWinObjs) > p->pPars->nWinSizeMax )
    {
        p->timeWin += Abc_Clock() - clk;
        return 0;
    }
    // compute controlability for node
    if ( Vec_IntSize(p->vTfo) == 0 )
        Abc_TtFill( Sbd_ObjSim2(p, Pivot), p->pPars->nWords );
    else
        Abc_TtClear( Sbd_ObjSim2(p, Pivot), p->pPars->nWords );
    Vec_IntForEachEntry( p->vTfo, Node, i )
        if ( Abc_LitIsCompl(Node) ) // root
            Abc_TtOrXor( Sbd_ObjSim2(p, Pivot), Sbd_ObjSim0(p, Abc_Lit2Var(Node)), Sbd_ObjSim1(p, Abc_Lit2Var(Node)), p->pPars->nWords );
    p->timeWin += Abc_Clock() - clk;
    // propagate controlability to fanins for the TFI nodes starting from the pivot
    Sbd_ManPropagateControl( p, Pivot );
    assert( Vec_IntSize(p->vDivValues) <= 64 );
    return (int)(Vec_IntSize(p->vDivValues) <= 64);
}